

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

void __thiscall
slang::ast::builtins::AssertControlTask::AssertControlTask(AssertControlTask *this,string *name)

{
  pointer pcVar1;
  int iVar2;
  
  (this->super_SystemTaskBase).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_0050fbb8;
  (this->super_SystemTaskBase).super_SystemSubroutine.name._M_dataplus._M_p =
       (pointer)&(this->super_SystemTaskBase).super_SystemSubroutine.name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_SystemTaskBase).super_SystemSubroutine.name,pcVar1,
             pcVar1 + name->_M_string_length);
  (this->super_SystemTaskBase).super_SystemSubroutine.kind = Task;
  (this->super_SystemTaskBase).super_SystemSubroutine.hasOutputArgs = false;
  (this->super_SystemTaskBase).super_SystemSubroutine.withClauseMode = None;
  (this->super_SystemTaskBase).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_0050f970;
  iVar2 = std::__cxx11::string::compare((char *)name);
  (this->super_SystemTaskBase).super_SystemSubroutine.field_0x34 = iVar2 == 0;
  return;
}

Assistant:

explicit AssertControlTask(const std::string& name) :
        SystemTaskBase(name), isFullMethod(name == "$assertcontrol") {}